

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_renorm(bitstream *str,h264_cabac_context *cabac)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uStack_28;
  uint32_t tmp;
  
  uStack_28 = in_RAX;
  while( true ) {
    while( true ) {
      if (0xff < cabac->codIRange) {
        return 0;
      }
      cabac->codIRange = cabac->codIRange * 2;
      uVar1 = cabac->codIOffset * 2;
      cabac->codIOffset = uVar1;
      if (str->dir != VS_ENCODE) break;
      if (uVar1 < 0x200) {
        iVar2 = put_bit(str,cabac,0);
        if (iVar2 != 0) {
          return 1;
        }
      }
      else if (uVar1 < 0x400) {
        cabac->bitsOutstanding = cabac->bitsOutstanding + 1;
        cabac->codIOffset = uVar1 - 0x200;
      }
      else {
        iVar2 = put_bit(str,cabac,1);
        if (iVar2 != 0) {
          return 1;
        }
        cabac->codIOffset = cabac->codIOffset - 0x400;
      }
    }
    iVar2 = vs_u(str,&tmp,1);
    if (iVar2 != 0) break;
    cabac->codIOffset = cabac->codIOffset | tmp;
  }
  return 1;
}

Assistant:

int h264_cabac_renorm(struct bitstream *str, struct h264_cabac_context *cabac) {
	while (cabac->codIRange < 256) {
		cabac->codIRange <<= 1;
		cabac->codIOffset <<= 1;
		if (str->dir == VS_ENCODE) {
			if (cabac->codIOffset < 512) {
				if (put_bit(str, cabac, 0))
					return 1;
			} else if (cabac->codIOffset >= 1024) {
				if (put_bit(str, cabac, 1))
					return 1;
				cabac->codIOffset -= 1024;
			} else {
				cabac->bitsOutstanding++;
				cabac->codIOffset -= 512;
			}
		} else {
			uint32_t tmp;
			if (vs_u(str, &tmp, 1))
				return 1;
			cabac->codIOffset |= tmp;
		}
	}
	return 0;
}